

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O1

SyntaxToken * __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
::lastToken(SyntaxToken *__return_storage_ptr__,
           CoreSyntaxNodeList<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
           *this)

{
  ExtKR_ParameterDeclarationSyntax *pEVar1;
  SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*> *it;
  ExtKR_ParameterDeclarationSyntax *this_00;
  
  this_00 = (ExtKR_ParameterDeclarationSyntax *)0x0;
  do {
    pEVar1 = (this->
             super_List<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
             ).value;
    this = &((this->
             super_List<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
             ).next)->
            super_CoreSyntaxNodeList<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
    ;
    if (pEVar1 != (ExtKR_ParameterDeclarationSyntax *)0x0) {
      this_00 = pEVar1;
    }
  } while (this != (CoreSyntaxNodeList<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
                    *)0x0);
  if (this_00 == (ExtKR_ParameterDeclarationSyntax *)0x0) {
    SyntaxToken::invalid();
  }
  else {
    SyntaxNode::lastToken(__return_storage_ptr__,(SyntaxNode *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual SyntaxToken lastToken() const override
    {
        SyntaxNodeT node = this->lastValue();
        if (node)
            return node->lastToken();
        return SyntaxToken::invalid();
    }